

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

Error * stick::fs::copyFile(Error *__return_storage_ptr__,String *_from,String *_to)

{
  SystemErrorCode SVar1;
  int __fd;
  int __fd_00;
  char *pcVar2;
  SystemErrorCode *pSVar3;
  Allocator *pAVar4;
  int *piVar5;
  byte local_11d9;
  String local_11c0;
  Error local_11a0;
  ssize_t local_1148;
  Int64 numBytesWritten;
  char *outPtr;
  undefined1 local_1130 [7];
  bool bBreak;
  Error local_1110;
  String local_10b8;
  Error local_1098;
  size_t local_1040;
  Size numBytesRead;
  char buffer [4096];
  int fdTo;
  int fdFrom;
  String *_to_local;
  String *_from_local;
  Error *ret;
  
  Error::Error(__return_storage_ptr__);
  pcVar2 = String::cString(_from);
  __fd = open(pcVar2,0);
  if (__fd == -1) {
    pSVar3 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar3;
    pAVar4 = defaultAllocator();
    String::String(&local_10b8,"",pAVar4);
    Error::Error<stick::ec::SystemErrorCode>
              (&local_1098,SVar1,&local_10b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1c9,(type *)0x0);
    Error::operator=(__return_storage_ptr__,&local_1098);
    Error::~Error(&local_1098);
    String::~String(&local_10b8);
  }
  pcVar2 = String::cString(_to);
  __fd_00 = open(pcVar2,0xc1,0x1b6);
  if (__fd_00 == -1) {
    pSVar3 = (SystemErrorCode *)__errno_location();
    SVar1 = *pSVar3;
    pAVar4 = defaultAllocator();
    String::String((String *)local_1130,"",pAVar4);
    Error::Error<stick::ec::SystemErrorCode>
              (&local_1110,SVar1,(String *)local_1130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
               ,0x1cf,(type *)0x0);
    Error::operator=(__return_storage_ptr__,&local_1110);
    Error::~Error(&local_1110);
    String::~String((String *)local_1130);
    close(__fd);
  }
  outPtr._7_1_ = 0;
  do {
    local_1040 = read(__fd,&numBytesRead,0x1000);
    local_11d9 = 0;
    if (local_1040 != 0) {
      local_11d9 = outPtr._7_1_ ^ 0xff;
    }
    if ((local_11d9 & 1) == 0) {
      if ((outPtr._7_1_ & 1) != 0) {
        pSVar3 = (SystemErrorCode *)__errno_location();
        SVar1 = *pSVar3;
        pAVar4 = defaultAllocator();
        String::String(&local_11c0,"",pAVar4);
        Error::Error<stick::ec::SystemErrorCode>
                  (&local_11a0,SVar1,&local_11c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/FileSystem.cpp"
                   ,0x1eb,(type *)0x0);
        Error::operator=(__return_storage_ptr__,&local_11a0);
        Error::~Error(&local_11a0);
        String::~String(&local_11c0);
      }
      close(__fd);
      close(__fd_00);
      return __return_storage_ptr__;
    }
    numBytesWritten = (Int64)&numBytesRead;
    do {
      local_1148 = write(__fd_00,(void *)numBytesWritten,local_1040);
      if (local_1148 < 0) {
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          outPtr._7_1_ = 1;
          break;
        }
      }
      else {
        local_1040 = local_1040 - local_1148;
        numBytesWritten = local_1148 + numBytesWritten;
      }
    } while (local_1040 != 0);
  } while( true );
}

Assistant:

Error copyFile(const String & _from, const String & _to)
{
    Error ret;
    int fdFrom, fdTo;
    char buffer[4096];
    Size numBytesRead;

    fdFrom = open(_from.cString(), O_RDONLY);
    if (fdFrom == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
    }

    fdTo = open(_to.cString(), O_WRONLY | O_CREAT | O_EXCL, 0666);
    if (fdTo == -1)
    {
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);
        close(fdFrom);
    }

    bool bBreak = false;
    while (numBytesRead = read(fdFrom, buffer, sizeof(buffer)), numBytesRead > 0 && !bBreak)
    {
        char * outPtr = buffer;
        Int64 numBytesWritten;
        do
        {
            numBytesWritten = write(fdTo, outPtr, numBytesRead);

            if (numBytesWritten >= 0)
            {
                numBytesRead -= numBytesWritten;
                outPtr += numBytesWritten;
            }
            else if (errno != EINTR)
            {
                bBreak = true;
                break;
            }
        } while (numBytesRead > 0);
    }

    // error, retrieve it
    if (bBreak)
        ret = Error(ec::SystemErrorCode(errno), "", STICK_FILE, STICK_LINE);

    close(fdFrom);
    close(fdTo);

    return ret;
}